

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrPlaneDetectorBeginInfoEXT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  XrGeneratedDispatchTable *pXVar6;
  ulong uVar7;
  allocator local_c99;
  string boundingboxpose_prefix;
  string boundingboxextent_prefix;
  string semantictypes_prefix;
  string orientations_prefix;
  string type_prefix;
  string minarea_prefix;
  string maxplanes_prefix;
  string semantictypecount_prefix;
  string orientationcount_prefix;
  string time_prefix;
  string basespace_prefix;
  string next_prefix;
  undefined1 local_b18 [32];
  string local_af8;
  undefined1 local_ad8 [32];
  string local_ab8;
  string local_a98;
  ostringstream oss_baseSpace;
  uint auStack_a60 [2];
  PFN_xrCreateSwapchain local_a58;
  PFN_xrCreateActionSpace p_Stack_a50;
  PFN_xrLocateSpace local_a48;
  PFN_xrAcquireSwapchainImage p_Stack_a40;
  ostringstream oss_semanticTypes_array;
  uint auStack_8e8 [88];
  ostringstream oss_minArea;
  undefined8 local_780 [46];
  ostringstream oss_orientationCount;
  ostringstream oss_orientations_array;
  uint auStack_480 [88];
  ostringstream oss_maxPlanes;
  ostringstream oss_semanticTypeCount;
  
  PointerToHexString<XrPlaneDetectorBeginInfoEXT>(value);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_baseSpace);
  std::__cxx11::string::~string((string *)&oss_baseSpace);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_baseSpace,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_baseSpace);
    std::__cxx11::string::~string((string *)&oss_baseSpace);
  }
  else {
    local_a48 = (PFN_xrLocateSpace)0x0;
    p_Stack_a40 = (PFN_xrAcquireSwapchainImage)0x0;
    local_a58 = (PFN_xrCreateSwapchain)0x0;
    p_Stack_a50 = (PFN_xrCreateActionSpace)0x0;
    auStack_a60[0] = 0;
    auStack_a60[1] = 0;
    _oss_baseSpace = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_baseSpace);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_baseSpace);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_a98,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_a98,contents);
  std::__cxx11::string::~string((string *)&local_a98);
  if (!bVar2) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&basespace_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&basespace_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_baseSpace);
  *(uint *)((long)auStack_a60 + *(long *)(_oss_baseSpace + -0x18)) =
       *(uint *)((long)auStack_a60 + *(long *)(_oss_baseSpace + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&oss_baseSpace);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [8])"XrSpace",&basespace_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_orientationCount);
  std::__cxx11::string::~string((string *)&oss_orientationCount);
  std::__cxx11::string::string((string *)&time_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&time_prefix);
  std::__cxx11::to_string((string *)&oss_orientationCount,value->time);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])"XrTime",&time_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_orientationCount);
  std::__cxx11::string::~string((string *)&oss_orientationCount);
  std::__cxx11::string::string((string *)&orientationcount_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&orientationcount_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_orientationCount);
  poVar4 = std::operator<<((ostream *)&oss_orientationCount,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&orientationcount_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_orientations_array);
  std::__cxx11::string::~string((string *)&oss_orientations_array);
  std::__cxx11::string::string((string *)&orientations_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&orientations_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_orientations_array);
  *(uint *)((long)auStack_480 + *(long *)(_oss_orientations_array + -0x18)) =
       *(uint *)((long)auStack_480 + *(long *)(_oss_orientations_array + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&oss_orientations_array);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [37])"const XrPlaneDetectorOrientationEXT*",&orientations_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_semanticTypeCount);
  std::__cxx11::string::~string((string *)&oss_semanticTypeCount);
  for (uVar7 = 0; uVar7 < value->orientationCount; uVar7 = uVar7 + 1) {
    std::__cxx11::string::string((string *)&oss_semanticTypeCount,(string *)&orientations_prefix);
    std::__cxx11::string::append((char *)&oss_semanticTypeCount);
    std::__cxx11::to_string((string *)&oss_semanticTypes_array,(uint)uVar7);
    std::__cxx11::string::append((string *)&oss_semanticTypeCount);
    std::__cxx11::string::~string((string *)&oss_semanticTypes_array);
    std::__cxx11::string::append((char *)&oss_semanticTypeCount);
    std::__cxx11::to_string((string *)&oss_semanticTypes_array,value->orientations[uVar7]);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [37])"const XrPlaneDetectorOrientationEXT*",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_semanticTypeCount,(string *)&oss_semanticTypes_array);
    std::__cxx11::string::~string((string *)&oss_semanticTypes_array);
    std::__cxx11::string::~string((string *)&oss_semanticTypeCount);
  }
  std::__cxx11::string::string((string *)&semantictypecount_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&semantictypecount_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_semanticTypeCount);
  poVar4 = std::operator<<((ostream *)&oss_semanticTypeCount,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&semantictypecount_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_semanticTypes_array);
  std::__cxx11::string::~string((string *)&oss_semanticTypes_array);
  std::__cxx11::string::string((string *)&semantictypes_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&semantictypes_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_semanticTypes_array);
  *(uint *)((long)auStack_8e8 + *(long *)(_oss_semanticTypes_array + -0x18)) =
       *(uint *)((long)auStack_8e8 + *(long *)(_oss_semanticTypes_array + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&oss_semanticTypes_array);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[38],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [38])"const XrPlaneDetectorSemanticTypeEXT*",
             &semantictypes_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_maxPlanes);
  std::__cxx11::string::~string((string *)&oss_maxPlanes);
  for (uVar7 = 0; uVar7 < value->semanticTypeCount; uVar7 = uVar7 + 1) {
    std::__cxx11::string::string((string *)&oss_maxPlanes,(string *)&semantictypes_prefix);
    std::__cxx11::string::append((char *)&oss_maxPlanes);
    std::__cxx11::to_string((string *)&oss_minArea,(uint)uVar7);
    std::__cxx11::string::append((string *)&oss_maxPlanes);
    std::__cxx11::string::~string((string *)&oss_minArea);
    std::__cxx11::string::append((char *)&oss_maxPlanes);
    std::__cxx11::to_string((string *)&oss_minArea,value->semanticTypes[uVar7]);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[38],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [38])"const XrPlaneDetectorSemanticTypeEXT*",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_maxPlanes,
               (string *)&oss_minArea);
    std::__cxx11::string::~string((string *)&oss_minArea);
    std::__cxx11::string::~string((string *)&oss_maxPlanes);
  }
  std::__cxx11::string::string((string *)&maxplanes_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&maxplanes_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_maxPlanes);
  poVar4 = std::operator<<((ostream *)&oss_maxPlanes,"0x");
  *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&maxplanes_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_minArea);
  std::__cxx11::string::~string((string *)&oss_minArea);
  std::__cxx11::string::string((string *)&minarea_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&minarea_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_minArea);
  *(undefined8 *)((long)local_780 + *(long *)(_oss_minArea + -0x18)) = 0x20;
  std::ostream::operator<<((ostream *)&oss_minArea,value->minArea);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])"float",&minarea_prefix,&boundingboxpose_prefix);
  std::__cxx11::string::~string((string *)&boundingboxpose_prefix);
  std::__cxx11::string::string((string *)&boundingboxpose_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&boundingboxpose_prefix);
  std::__cxx11::string::string((string *)(local_ad8 + 0x20),(string *)&boundingboxpose_prefix);
  pXVar6 = (XrGeneratedDispatchTable *)local_ad8;
  std::__cxx11::string::string((string *)pXVar6,"XrPosef",(allocator *)&boundingboxextent_prefix);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar6,&value->boundingBoxPose,(string *)(local_ad8 + 0x20),(string *)local_ad8
                     ,false,contents);
  std::__cxx11::string::~string((string *)local_ad8);
  std::__cxx11::string::~string((string *)(local_ad8 + 0x20));
  if (bVar2) {
    std::__cxx11::string::string((string *)&boundingboxextent_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&boundingboxextent_prefix);
    std::__cxx11::string::string((string *)(local_b18 + 0x20),(string *)&boundingboxextent_prefix);
    pXVar6 = (XrGeneratedDispatchTable *)local_b18;
    std::__cxx11::string::string((string *)pXVar6,"XrExtent3DfEXT",&local_c99);
    bVar2 = ApiDumpOutputXrStruct
                      (pXVar6,&value->boundingBoxExtent,(string *)(local_b18 + 0x20),
                       (string *)local_b18,false,contents);
    std::__cxx11::string::~string((string *)local_b18);
    std::__cxx11::string::~string((string *)(local_b18 + 0x20));
    if (bVar2) {
      std::__cxx11::string::~string((string *)&boundingboxextent_prefix);
      std::__cxx11::string::~string((string *)&boundingboxpose_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_minArea);
      std::__cxx11::string::~string((string *)&minarea_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_maxPlanes);
      std::__cxx11::string::~string((string *)&maxplanes_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_semanticTypes_array);
      std::__cxx11::string::~string((string *)&semantictypes_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_semanticTypeCount);
      std::__cxx11::string::~string((string *)&semantictypecount_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_orientations_array);
      std::__cxx11::string::~string((string *)&orientations_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_orientationCount);
      std::__cxx11::string::~string((string *)&orientationcount_prefix);
      std::__cxx11::string::~string((string *)&time_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_baseSpace);
      std::__cxx11::string::~string((string *)&basespace_prefix);
      std::__cxx11::string::~string((string *)&next_prefix);
      std::__cxx11::string::~string((string *)&type_prefix);
      return true;
    }
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPlaneDetectorBeginInfoEXT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string basespace_prefix = prefix;
        basespace_prefix += "baseSpace";
        std::ostringstream oss_baseSpace;
        oss_baseSpace << std::hex << reinterpret_cast<const void*>(value->baseSpace);
        contents.emplace_back("XrSpace", basespace_prefix, oss_baseSpace.str());
        std::string time_prefix = prefix;
        time_prefix += "time";
        contents.emplace_back("XrTime", time_prefix, std::to_string(value->time));
        std::string orientationcount_prefix = prefix;
        orientationcount_prefix += "orientationCount";
        std::ostringstream oss_orientationCount;
        oss_orientationCount << "0x" << std::hex << (value->orientationCount);
        contents.emplace_back("uint32_t", orientationcount_prefix, oss_orientationCount.str());
        std::string orientations_prefix = prefix;
        orientations_prefix += "orientations";
        std::ostringstream oss_orientations_array;
        oss_orientations_array << std::hex << reinterpret_cast<const void*>(value->orientations);
        contents.emplace_back("const XrPlaneDetectorOrientationEXT*", orientations_prefix, oss_orientations_array.str());
        for (uint32_t value_orientations_inc = 0; value_orientations_inc < value->orientationCount; ++value_orientations_inc) {
            std::string orientations_array_prefix = orientations_prefix;
            orientations_array_prefix += "[";
            orientations_array_prefix += std::to_string(value_orientations_inc);
            orientations_array_prefix += "]";
            contents.emplace_back("const XrPlaneDetectorOrientationEXT*", orientations_array_prefix, std::to_string(value->orientations[value_orientations_inc]));
        }
        std::string semantictypecount_prefix = prefix;
        semantictypecount_prefix += "semanticTypeCount";
        std::ostringstream oss_semanticTypeCount;
        oss_semanticTypeCount << "0x" << std::hex << (value->semanticTypeCount);
        contents.emplace_back("uint32_t", semantictypecount_prefix, oss_semanticTypeCount.str());
        std::string semantictypes_prefix = prefix;
        semantictypes_prefix += "semanticTypes";
        std::ostringstream oss_semanticTypes_array;
        oss_semanticTypes_array << std::hex << reinterpret_cast<const void*>(value->semanticTypes);
        contents.emplace_back("const XrPlaneDetectorSemanticTypeEXT*", semantictypes_prefix, oss_semanticTypes_array.str());
        for (uint32_t value_semantictypes_inc = 0; value_semantictypes_inc < value->semanticTypeCount; ++value_semantictypes_inc) {
            std::string semantictypes_array_prefix = semantictypes_prefix;
            semantictypes_array_prefix += "[";
            semantictypes_array_prefix += std::to_string(value_semantictypes_inc);
            semantictypes_array_prefix += "]";
            contents.emplace_back("const XrPlaneDetectorSemanticTypeEXT*", semantictypes_array_prefix, std::to_string(value->semanticTypes[value_semantictypes_inc]));
        }
        std::string maxplanes_prefix = prefix;
        maxplanes_prefix += "maxPlanes";
        std::ostringstream oss_maxPlanes;
        oss_maxPlanes << "0x" << std::hex << (value->maxPlanes);
        contents.emplace_back("uint32_t", maxplanes_prefix, oss_maxPlanes.str());
        std::string minarea_prefix = prefix;
        minarea_prefix += "minArea";
        std::ostringstream oss_minArea;
        oss_minArea << std::setprecision(32) << (value->minArea);
        contents.emplace_back("float", minarea_prefix, oss_minArea.str());
        std::string boundingboxpose_prefix = prefix;
        boundingboxpose_prefix += "boundingBoxPose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->boundingBoxPose, boundingboxpose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string boundingboxextent_prefix = prefix;
        boundingboxextent_prefix += "boundingBoxExtent";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->boundingBoxExtent, boundingboxextent_prefix, "XrExtent3DfEXT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}